

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintpreviewdialog.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_1ee485::LineEdit::focusInEvent(LineEdit *this,QFocusEvent *e)

{
  QFocusEvent *in_RDI;
  long in_FS_OFFSET;
  QString *in_stack_ffffffffffffffb8;
  QString *this_00;
  QString local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &local_20;
  QLineEdit::text();
  QString::operator=(this_00,in_stack_ffffffffffffffb8);
  QString::~QString((QString *)0x17fc86);
  QLineEdit::focusInEvent(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void focusInEvent(QFocusEvent *e) override
    {
        origText = text();
        QLineEdit::focusInEvent(e);
    }